

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

size_t mg_parse_multipart(char *buf,size_t buf_len,char *var_name,size_t var_name_len,
                         char *file_name,size_t file_name_len,char **data,size_t *data_len)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 local_80 [8];
  mg_str header;
  size_t cdl;
  size_t pos;
  size_t ll;
  size_t n;
  size_t bl;
  size_t hl;
  size_t file_name_len_local;
  char *file_name_local;
  size_t var_name_len_local;
  char *var_name_local;
  size_t buf_len_local;
  char *buf_local;
  
  header.len = 0x15;
  if ((buf != (char *)0x0) && (buf_len != 0)) {
    iVar1 = get_request_len(buf,(int)buf_len);
    sVar2 = (size_t)iVar1;
    if ((sVar2 != 0) && (((*buf == '-' && (buf[1] == '-')) && (buf[2] != '\n')))) {
      sVar3 = get_line_len(buf,buf_len);
      *file_name = '\0';
      *var_name = '\0';
      ll = sVar3;
      while (sVar4 = get_line_len(buf + ll,sVar2 - ll), cdl = sVar2, sVar4 != 0) {
        iVar1 = mg_ncasecmp("Content-Disposition: ",buf + ll,header.len);
        if (iVar1 == 0) {
          local_80 = (undefined1  [8])(buf + header.len + ll);
          header.p = (char *)(sVar4 - (header.len + 2));
          mg_http_parse_header((mg_str *)local_80,"name",var_name,var_name_len);
          mg_http_parse_header((mg_str *)local_80,"filename",file_name,file_name_len);
        }
        ll = sVar4 + ll;
      }
      for (; cdl + (sVar3 - 2) < buf_len; cdl = cdl + 1) {
        if ((buf[cdl] == '-') && (iVar1 = memcmp(buf,buf + cdl,sVar3 - 2), iVar1 == 0)) {
          if (data_len != (size_t *)0x0) {
            *data_len = (cdl - 2) - sVar2;
          }
          if (data != (char **)0x0) {
            *data = buf + sVar2;
          }
          return cdl;
        }
      }
    }
  }
  return 0;
}

Assistant:

size_t mg_parse_multipart(const char *buf, size_t buf_len, char *var_name,
                          size_t var_name_len, char *file_name,
                          size_t file_name_len, const char **data,
                          size_t *data_len) {
    static const char cd[] = "Content-Disposition: ";
    size_t hl, bl, n, ll, pos, cdl = sizeof(cd) - 1;

    if (buf == NULL || buf_len <= 0) return 0;
    if ((hl = get_request_len(buf, buf_len)) <= 0) return 0;
    if (buf[0] != '-' || buf[1] != '-' || buf[2] == '\n') return 0;

    /* Get boundary length */
    bl = get_line_len(buf, buf_len);

    /* Loop through headers, fetch variable name and file name */
    var_name[0] = file_name[0] = '\0';
    for (n = bl; (ll = get_line_len(buf + n, hl - n)) > 0; n += ll) {
        if (mg_ncasecmp(cd, buf + n, cdl) == 0) {
            struct mg_str header;
            header.p = buf + n + cdl;
            header.len = ll - (cdl + 2);
            mg_http_parse_header(&header, "name", var_name, var_name_len);
            mg_http_parse_header(&header, "filename", file_name, file_name_len);
        }
    }

    /* Scan through the body, search for terminating boundary */
    for (pos = hl; pos + (bl - 2) < buf_len; pos++) {
        if (buf[pos] == '-' && !memcmp(buf, &buf[pos], bl - 2)) {
            if (data_len != NULL) *data_len = (pos - 2) - hl;
            if (data != NULL) *data = buf + hl;
            return pos;
        }
    }

    return 0;
}